

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLExporter.cpp
# Opt level: O0

void __thiscall
Assimp::STLExporter::STLExporter
          (STLExporter *this,char *_filename,aiScene *pScene,bool exportPointClouds,bool binary)

{
  aiScene *paVar1;
  DeadlyImportError *this_00;
  ostream *poVar2;
  uint local_130;
  allocator local_129;
  uint i_2;
  string name;
  string local_100;
  uint local_e0;
  undefined1 local_da;
  allocator local_d9;
  uint i_1;
  uint local_b4;
  uint local_b0;
  uint j;
  uint i;
  uint meshnum;
  char buf [80];
  locale local_50 [8];
  locale local_48 [8];
  locale *local_40;
  locale *l;
  allocator local_23;
  byte local_22;
  byte local_21;
  bool binary_local;
  aiScene *paStack_20;
  bool exportPointClouds_local;
  aiScene *pScene_local;
  char *_filename_local;
  STLExporter *this_local;
  
  local_22 = binary;
  local_21 = exportPointClouds;
  paStack_20 = pScene;
  pScene_local = (aiScene *)_filename;
  _filename_local = (char *)this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  paVar1 = pScene_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->filename,(char *)paVar1,&local_23);
  std::allocator<char>::~allocator((allocator<char> *)&local_23);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->endl,"\n",(allocator *)((long)&l + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&l + 3));
  std::locale::locale(local_48,"C");
  local_40 = local_48;
  std::ios::imbue(local_50);
  std::locale::~locale(local_50);
  std::ios_base::precision((ios_base *)(&this->mOutput + *(long *)(*(long *)this + -0x18)),8);
  if ((local_22 & 1) == 0) {
    if ((local_21 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_100,"Assimp_Pointcloud",
                 (allocator *)(name.field_2._M_local_buf + 0xf));
      WritePointCloud(this,&local_100,paStack_20);
      std::__cxx11::string::~string((string *)&local_100);
      std::allocator<char>::~allocator((allocator<char> *)(name.field_2._M_local_buf + 0xf));
      name.field_2._8_4_ = 1;
      goto LAB_004b3aa1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&i_2,"AssimpScene",&local_129);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
    poVar2 = std::operator<<((ostream *)this,SolidToken);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = std::operator<<(poVar2,(string *)&i_2);
    std::operator<<(poVar2,(string *)&this->endl);
    for (local_130 = 0; local_130 < paStack_20->mNumMeshes; local_130 = local_130 + 1) {
      WriteMesh(this,paStack_20->mMeshes[local_130]);
    }
    poVar2 = std::operator<<((ostream *)this,EndSolidToken);
    poVar2 = std::operator<<(poVar2,(string *)&i_2);
    std::operator<<(poVar2,(string *)&this->endl);
    std::__cxx11::string::~string((string *)&i_2);
  }
  else {
    buf[0x38] = '\0';
    buf[0x39] = '\0';
    buf[0x3a] = '\0';
    buf[0x3b] = '\0';
    buf[0x3c] = '\0';
    buf[0x3d] = '\0';
    buf[0x3e] = '\0';
    buf[0x3f] = '\0';
    buf[0x40] = '\0';
    buf[0x41] = '\0';
    buf[0x42] = '\0';
    buf[0x43] = '\0';
    buf[0x44] = '\0';
    buf[0x45] = '\0';
    buf[0x46] = '\0';
    buf[0x47] = '\0';
    buf[0x28] = '\0';
    buf[0x29] = '\0';
    buf[0x2a] = '\0';
    buf[0x2b] = '\0';
    buf[0x2c] = '\0';
    buf[0x2d] = '\0';
    buf[0x2e] = '\0';
    buf[0x2f] = '\0';
    buf[0x30] = '\0';
    buf[0x31] = '\0';
    buf[0x32] = '\0';
    buf[0x33] = '\0';
    buf[0x34] = '\0';
    buf[0x35] = '\0';
    buf[0x36] = '\0';
    buf[0x37] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0x20] = '\0';
    buf[0x21] = '\0';
    buf[0x22] = '\0';
    buf[0x23] = '\0';
    buf[0x24] = '\0';
    buf[0x25] = '\0';
    buf[0x26] = '\0';
    buf[0x27] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    _i = 0x6353706d69737341;
    builtin_strncpy(buf,"ene",4);
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    std::ostream::write((char *)this,(long)&i);
    j = 0;
    for (local_b0 = 0; local_b0 < paStack_20->mNumMeshes; local_b0 = local_b0 + 1) {
      for (local_b4 = 0; local_b4 < paStack_20->mMeshes[local_b0]->mNumFaces;
          local_b4 = local_b4 + 1) {
        j = j + 1;
      }
    }
    std::ostream::write((char *)this,(long)&j);
    if ((local_21 & 1) != 0) {
      local_da = 1;
      this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&i_1,"This functionality is not yet implemented for binary output.",
                 &local_d9);
      DeadlyImportError::DeadlyImportError(this_00,(string *)&i_1);
      local_da = 0;
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    for (local_e0 = 0; local_e0 < paStack_20->mNumMeshes; local_e0 = local_e0 + 1) {
      WriteMeshBinary(this,paStack_20->mMeshes[local_e0]);
    }
  }
  name.field_2._8_4_ = 0;
LAB_004b3aa1:
  std::locale::~locale(local_48);
  return;
}

Assistant:

STLExporter::STLExporter(const char* _filename, const aiScene* pScene, bool exportPointClouds, bool binary)
: filename(_filename)
, endl("\n")
{
    // make sure that all formatting happens using the standard, C locale and not the user's current locale
    const std::locale& l = std::locale("C");
    mOutput.imbue(l);
    mOutput.precision(ASSIMP_AI_REAL_TEXT_PRECISION);
    if (binary) {
        char buf[80] = {0} ;
        buf[0] = 'A'; buf[1] = 's'; buf[2] = 's'; buf[3] = 'i'; buf[4] = 'm'; buf[5] = 'p';
        buf[6] = 'S'; buf[7] = 'c'; buf[8] = 'e'; buf[9] = 'n'; buf[10] = 'e';
        mOutput.write(buf, 80);
        unsigned int meshnum = 0;
        for(unsigned int i = 0; i < pScene->mNumMeshes; ++i) {
            for (unsigned int j = 0; j < pScene->mMeshes[i]->mNumFaces; ++j) {
                meshnum++;
            }
        }
        AI_SWAP4(meshnum);
        mOutput.write((char *)&meshnum, 4);

        if (exportPointClouds) {
            throw DeadlyExportError("This functionality is not yet implemented for binary output.");
        }

        for(unsigned int i = 0; i < pScene->mNumMeshes; ++i) {
            WriteMeshBinary(pScene->mMeshes[i]);
        }
    } else {

        // Exporting only point clouds
        if (exportPointClouds) {
            WritePointCloud("Assimp_Pointcloud", pScene );
            return;
        } 

        // Export the assimp mesh 
        const std::string name = "AssimpScene";
        mOutput << SolidToken << " " << name << endl;
        for(unsigned int i = 0; i < pScene->mNumMeshes; ++i) {
            WriteMesh(pScene->mMeshes[ i ]);
        }
        mOutput << EndSolidToken << name << endl;
    }
}